

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dna_bwt_n.hpp
# Opt level: O0

p_node_n * __thiscall dna_bwt_n<dna_string_n>::LF(dna_bwt_n<dna_string_n> *this,sa_node_n N)

{
  long in_RSI;
  p_node_n *in_RDI;
  long in_stack_00000008;
  long in_stack_00000010;
  long in_stack_00000018;
  long in_stack_00000020;
  long in_stack_00000028;
  long in_stack_00000030;
  long in_stack_00000038;
  long in_stack_00000040;
  p_rank_n before_end;
  p_rank_n before_T;
  p_rank_n before_N;
  p_rank_n before_G;
  p_rank_n before_C;
  p_rank_n before_A;
  p_rank_n before_TERM;
  p_node_n *this_00;
  undefined1 local_238 [40];
  undefined1 local_210 [40];
  undefined1 local_1e8 [40];
  undefined1 local_1c0 [40];
  undefined1 local_198 [40];
  undefined1 local_170 [40];
  undefined1 local_148 [40];
  long local_120;
  long local_118;
  long local_110;
  long local_108;
  long local_100;
  long local_f8;
  long local_f0;
  long local_e8;
  long local_e0;
  long local_d8;
  long local_d0;
  long local_c8;
  long local_c0;
  long local_b8;
  long local_b0;
  long local_a8;
  long local_a0;
  long local_98;
  long local_90;
  long local_88;
  long local_80;
  long local_78;
  long local_70;
  long local_68;
  long local_60;
  long local_58;
  long local_50;
  long local_48;
  long local_40;
  long local_38;
  long local_30;
  long local_28;
  long local_20;
  long local_18;
  long local_10;
  
  this_00 = in_RDI;
  parallel_rank((dna_bwt_n<dna_string_n> *)in_RDI,(uint64_t)in_RDI);
  memcpy(&local_30,local_148,0x28);
  if (in_stack_00000010 == in_stack_00000008) {
    memcpy(&local_58,&local_30,0x28);
  }
  else {
    parallel_rank((dna_bwt_n<dna_string_n> *)this_00,(uint64_t)in_RDI);
    memcpy(&local_58,local_170,0x28);
  }
  if (in_stack_00000018 == in_stack_00000010) {
    memcpy(&local_80,&local_58,0x28);
  }
  else {
    parallel_rank((dna_bwt_n<dna_string_n> *)this_00,(uint64_t)in_RDI);
    memcpy(&local_80,local_198,0x28);
  }
  if (in_stack_00000020 == in_stack_00000018) {
    memcpy(&local_a8,&local_80,0x28);
  }
  else {
    parallel_rank((dna_bwt_n<dna_string_n> *)this_00,(uint64_t)in_RDI);
    memcpy(&local_a8,local_1c0,0x28);
  }
  if (in_stack_00000028 == in_stack_00000020) {
    memcpy(&local_d0,&local_a8,0x28);
  }
  else {
    parallel_rank((dna_bwt_n<dna_string_n> *)this_00,(uint64_t)in_RDI);
    memcpy(&local_d0,local_1e8,0x28);
  }
  if (in_stack_00000030 == in_stack_00000028) {
    memcpy(&local_f8,&local_d0,0x28);
  }
  else {
    parallel_rank((dna_bwt_n<dna_string_n> *)this_00,(uint64_t)in_RDI);
    memcpy(&local_f8,local_210,0x28);
  }
  if (in_stack_00000038 == in_stack_00000030) {
    memcpy(&local_120,&local_f8,0x28);
  }
  else {
    parallel_rank((dna_bwt_n<dna_string_n> *)this_00,(uint64_t)in_RDI);
    memcpy(&local_120,local_238,0x28);
  }
  (in_RDI->A).first_TERM = *(long *)(in_RSI + 0x10) + local_30;
  (in_RDI->A).first_A = *(long *)(in_RSI + 0x10) + local_58;
  (in_RDI->A).first_C = *(long *)(in_RSI + 0x10) + local_80;
  (in_RDI->A).first_G = *(long *)(in_RSI + 0x10) + local_a8;
  (in_RDI->A).first_N = *(long *)(in_RSI + 0x10) + local_d0;
  (in_RDI->A).first_T = *(long *)(in_RSI + 0x10) + local_f8;
  (in_RDI->A).last = *(long *)(in_RSI + 0x10) + local_120;
  (in_RDI->A).depth = in_stack_00000040 + 1;
  (in_RDI->C).first_TERM = *(long *)(in_RSI + 0x18) + local_28;
  (in_RDI->C).first_A = *(long *)(in_RSI + 0x18) + local_50;
  (in_RDI->C).first_C = *(long *)(in_RSI + 0x18) + local_78;
  (in_RDI->C).first_G = *(long *)(in_RSI + 0x18) + local_a0;
  (in_RDI->C).first_N = *(long *)(in_RSI + 0x18) + local_c8;
  (in_RDI->C).first_T = *(long *)(in_RSI + 0x18) + local_f0;
  (in_RDI->C).last = *(long *)(in_RSI + 0x18) + local_118;
  (in_RDI->C).depth = in_stack_00000040 + 1;
  (in_RDI->G).first_TERM = *(long *)(in_RSI + 0x20) + local_20;
  (in_RDI->G).first_A = *(long *)(in_RSI + 0x20) + local_48;
  (in_RDI->G).first_C = *(long *)(in_RSI + 0x20) + local_70;
  (in_RDI->G).first_G = *(long *)(in_RSI + 0x20) + local_98;
  (in_RDI->G).first_N = *(long *)(in_RSI + 0x20) + local_c0;
  (in_RDI->G).first_T = *(long *)(in_RSI + 0x20) + local_e8;
  (in_RDI->G).last = *(long *)(in_RSI + 0x20) + local_110;
  (in_RDI->G).depth = in_stack_00000040 + 1;
  (in_RDI->N).first_TERM = *(long *)(in_RSI + 0x28) + local_18;
  (in_RDI->N).first_A = *(long *)(in_RSI + 0x28) + local_40;
  (in_RDI->N).first_C = *(long *)(in_RSI + 0x28) + local_68;
  (in_RDI->N).first_G = *(long *)(in_RSI + 0x28) + local_90;
  (in_RDI->N).first_N = *(long *)(in_RSI + 0x28) + local_b8;
  (in_RDI->N).first_T = *(long *)(in_RSI + 0x28) + local_e0;
  (in_RDI->N).last = *(long *)(in_RSI + 0x28) + local_108;
  (in_RDI->N).depth = in_stack_00000040 + 1;
  (in_RDI->T).first_TERM = *(long *)(in_RSI + 0x30) + local_10;
  (in_RDI->T).first_A = *(long *)(in_RSI + 0x30) + local_38;
  (in_RDI->T).first_C = *(long *)(in_RSI + 0x30) + local_60;
  (in_RDI->T).first_G = *(long *)(in_RSI + 0x30) + local_88;
  (in_RDI->T).first_N = *(long *)(in_RSI + 0x30) + local_b0;
  (in_RDI->T).first_T = *(long *)(in_RSI + 0x30) + local_d8;
  (in_RDI->T).last = *(long *)(in_RSI + 0x30) + local_100;
  (in_RDI->T).depth = in_stack_00000040 + 1;
  return this_00;
}

Assistant:

p_node_n LF(sa_node_n N){

		p_rank_n before_TERM;
		p_rank_n before_A;
		p_rank_n before_C;
		p_rank_n before_G;
		p_rank_n before_N;
		p_rank_n before_T;
		p_rank_n before_end;

		before_TERM = parallel_rank(N.first_TERM);

		if(N.first_A == N.first_TERM) before_A = before_TERM;
		else before_A = parallel_rank(N.first_A);

		if(N.first_C == N.first_A) before_C = before_A;
		else before_C = parallel_rank(N.first_C);

		if(N.first_G == N.first_C) before_G = before_C;
		else before_G = parallel_rank(N.first_G);

		if(N.first_N == N.first_G) before_N = before_G;
		else before_N = parallel_rank(N.first_N);

		if(N.first_T == N.first_N) before_T = before_N;
		else before_T = parallel_rank(N.first_T);

		if(N.last == N.first_T) before_end = before_T;
		else before_end = parallel_rank(N.last);



		return {
			{F_A + before_TERM.A, F_A + before_A.A, F_A + before_C.A, F_A + before_G.A, F_A + before_N.A, F_A + before_T.A, F_A + before_end.A, N.depth+1},
			{F_C + before_TERM.C, F_C + before_A.C, F_C + before_C.C, F_C + before_G.C, F_C + before_N.C, F_C + before_T.C, F_C + before_end.C, N.depth+1},
			{F_G + before_TERM.G, F_G + before_A.G, F_G + before_C.G, F_G + before_G.G, F_G + before_N.G, F_G + before_T.G, F_G + before_end.G, N.depth+1},
			{F_N + before_TERM.N, F_N + before_A.N, F_N + before_C.N, F_N + before_G.N, F_N + before_N.N, F_N + before_T.N, F_N + before_end.N, N.depth+1},
			{F_T + before_TERM.T, F_T + before_A.T, F_T + before_C.T, F_T + before_G.T, F_T + before_N.T, F_T + before_T.T, F_T + before_end.T, N.depth+1}
		};

	}